

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

void process_example(vw *all,bfgs *b,example *ec)

{
  float *pfVar1;
  loss_function *plVar2;
  shared_data *psVar3;
  size_t sVar4;
  undefined8 in_RAX;
  ulong uVar5;
  float fVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  float temp;
  undefined8 local_28;
  
  if (b->first_pass == true) {
    b->importance_weight_sum = (double)ec->weight + b->importance_weight_sum;
  }
  if (b->gradient_pass == true) {
    local_28 = in_RAX;
    fVar6 = predict_and_gradient(all,ec);
    (ec->pred).scalar = fVar6;
    (*all->loss->_vptr_loss_function[1])
              (CONCAT44(extraout_XMM0_Db,fVar6),(ulong)(ec->l).multi.label,all->loss,all->sd);
    fVar6 = extraout_XMM0_Da * ec->weight;
    ec->loss = fVar6;
    b->loss_sum = (double)fVar6 + b->loss_sum;
    v_array<float>::push_back(&b->predictions,&(ec->pred).scalar);
  }
  else {
    local_28._4_4_ = *(undefined4 *)((long)&ec->l + 8);
    local_28._0_4_ = (float)in_RAX;
    GD::foreach_feature<float,_float_&,_&add_DIR>(all,ec,(float *)((long)&local_28 + 4));
    local_28 = CONCAT44(local_28._4_4_,local_28._4_4_);
    pfVar1 = (b->predictions)._begin;
    uVar5 = (long)(b->predictions)._end - (long)pfVar1 >> 2;
    if (uVar5 <= b->example_number) {
      b->example_number = uVar5 - 1;
    }
    fVar6 = pfVar1[b->example_number];
    (ec->pred).multiclass = (uint32_t)fVar6;
    ec->partial_prediction = (b->predictions)._begin[b->example_number];
    (*all->loss->_vptr_loss_function[1])
              ((ulong)(uint)fVar6,(ulong)(ec->l).multi.label,all->loss,all->sd);
    ec->loss = extraout_XMM0_Da_00 * ec->weight;
    plVar2 = all->loss;
    psVar3 = all->sd;
    pfVar1 = (b->predictions)._begin;
    sVar4 = b->example_number;
    b->example_number = sVar4 + 1;
    (*plVar2->_vptr_loss_function[7])
              ((ulong)(uint)pfVar1[sVar4],(ulong)(ec->l).multi.label,plVar2,psVar3);
    b->curvature = (double)ec->weight *
                   (double)extraout_XMM0_Da_01 * (double)(float)local_28 * (double)(float)local_28 +
                   b->curvature;
  }
  ec->updated_prediction = (ec->pred).scalar;
  if (b->preconditioner_pass == true) {
    update_preconditioner(all,ec);
  }
  return;
}

Assistant:

void process_example(vw& all, bfgs& b, example& ec)
{
  label_data& ld = ec.l.simple;
  if (b.first_pass)
    b.importance_weight_sum += ec.weight;

  /********************************************************************/
  /* I) GRADIENT CALCULATION ******************************************/
  /********************************************************************/
  if (b.gradient_pass)
  {
    ec.pred.scalar = predict_and_gradient(all, ec);  // w[0] & w[1]
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) * ec.weight;
    b.loss_sum += ec.loss;
    b.predictions.push_back(ec.pred.scalar);
  }
  /********************************************************************/
  /* II) CURVATURE CALCULATION ****************************************/
  /********************************************************************/
  else  // computing curvature
  {
    float d_dot_x = dot_with_direction(all, ec);   // w[2]
    if (b.example_number >= b.predictions.size())  // Make things safe in case example source is strange.
      b.example_number = b.predictions.size() - 1;
    ec.pred.scalar = b.predictions[b.example_number];
    ec.partial_prediction = b.predictions[b.example_number];
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) * ec.weight;
    float sd = all.loss->second_derivative(all.sd, b.predictions[b.example_number++], ld.label);
    b.curvature += ((double)d_dot_x) * d_dot_x * sd * ec.weight;
  }
  ec.updated_prediction = ec.pred.scalar;

  if (b.preconditioner_pass)
    update_preconditioner(all, ec);  // w[3]
}